

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O3

int __thiscall ncnn::LSTM::forward(LSTM *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t sVar1;
  long lVar2;
  int _h;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  void *__dest;
  int iVar9;
  void *__src;
  void *ptr;
  void *ptr_1;
  Mat local_198;
  Mat local_150;
  size_t local_110;
  void *local_108;
  size_t local_100;
  void *local_f8;
  Mat local_f0;
  Mat local_b0;
  Mat local_70;
  
  _h = bottom_blob->h;
  Mat::create(top_blob,this->num_output << (this->direction == 2),_h,4,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  iVar6 = this->direction;
  if (iVar6 == 0) {
    local_150.w = (this->weight_xc_data).w;
    local_150.h = (this->weight_xc_data).h;
    local_150.data = (this->weight_xc_data).data;
    local_150.elemsize = (this->weight_xc_data).elemsize;
    local_150.elempack = (this->weight_xc_data).elempack;
    local_150.allocator = (this->weight_xc_data).allocator;
    local_150.refcount = (int *)0x0;
    local_150.dims = 2;
    local_150.c = 1;
    local_150.cstep = (size_t)(local_150.h * local_150.w);
    local_198.w = (this->bias_c_data).w;
    local_198.h = (this->bias_c_data).h;
    local_198.data = (this->bias_c_data).data;
    local_198.elemsize = (this->bias_c_data).elemsize;
    local_198.elempack = (this->bias_c_data).elempack;
    local_198.allocator = (this->bias_c_data).allocator;
    local_198.refcount = (int *)0x0;
    local_198.dims = 2;
    local_198.c = 1;
    local_198.cstep = (size_t)(local_198.h * local_198.w);
    local_f0.w = (this->weight_hc_data).w;
    local_f0.h = (this->weight_hc_data).h;
    local_f0.data = (this->weight_hc_data).data;
    local_f0.elemsize = (this->weight_hc_data).elemsize;
    local_f0.elempack = (this->weight_hc_data).elempack;
    local_f0.allocator = (this->weight_hc_data).allocator;
    local_f0.refcount = (int *)0x0;
    local_f0.dims = 2;
    local_f0.c = 1;
    local_f0.cstep = (size_t)(local_f0.h * local_f0.w);
    iVar6 = lstm(bottom_blob,top_blob,0,&local_150,&local_198,&local_f0,opt);
    if (iVar6 != 0) {
      return iVar6;
    }
    iVar6 = this->direction;
  }
  if (iVar6 == 1) {
    local_150.w = (this->weight_xc_data).w;
    local_150.h = (this->weight_xc_data).h;
    local_150.data = (this->weight_xc_data).data;
    local_150.elemsize = (this->weight_xc_data).elemsize;
    local_150.elempack = (this->weight_xc_data).elempack;
    local_150.allocator = (this->weight_xc_data).allocator;
    local_150.refcount = (int *)0x0;
    local_150.dims = 2;
    local_150.c = 1;
    local_150.cstep = (size_t)(local_150.h * local_150.w);
    local_198.w = (this->bias_c_data).w;
    local_198.h = (this->bias_c_data).h;
    local_198.data = (this->bias_c_data).data;
    local_198.elemsize = (this->bias_c_data).elemsize;
    local_198.elempack = (this->bias_c_data).elempack;
    local_198.allocator = (this->bias_c_data).allocator;
    local_198.refcount = (int *)0x0;
    local_198.dims = 2;
    local_198.c = 1;
    local_198.cstep = (size_t)(local_198.h * local_198.w);
    local_f0.w = (this->weight_hc_data).w;
    local_f0.h = (this->weight_hc_data).h;
    local_f0.data = (this->weight_hc_data).data;
    local_f0.elemsize = (this->weight_hc_data).elemsize;
    local_f0.elempack = (this->weight_hc_data).elempack;
    local_f0.allocator = (this->weight_hc_data).allocator;
    local_f0.refcount = (int *)0x0;
    local_f0.dims = 2;
    local_f0.c = 1;
    local_f0.cstep = (size_t)(local_f0.h * local_f0.w);
    iVar6 = lstm(bottom_blob,top_blob,1,&local_150,&local_198,&local_f0,opt);
    if (iVar6 != 0) {
      return iVar6;
    }
    iVar6 = this->direction;
  }
  if (iVar6 != 2) {
    return 0;
  }
  local_150.w = this->num_output;
  local_150.allocator = opt->workspace_allocator;
  local_150.elemsize = 4;
  local_150.elempack = 1;
  local_150.dims = 2;
  local_150.c = 1;
  local_150.cstep = (size_t)(local_150.w * _h);
  if (local_150.w * _h == 0) {
    return -100;
  }
  lVar2 = local_150.cstep * 4;
  sVar1 = local_150.cstep * 4 + 4;
  local_150.h = _h;
  if (local_150.allocator == (Allocator *)0x0) {
    local_198.data = (void *)0x0;
    iVar6 = posix_memalign(&local_198.data,0x10,sVar1);
    local_150.data = (void *)0x0;
    if (iVar6 == 0) {
      local_150.data = local_198.data;
    }
  }
  else {
    local_150.data =
         (void *)(**(code **)(*(long *)local_150.allocator + 0x10))(local_150.allocator,sVar1);
  }
  local_150.refcount = (int *)(lVar2 + (long)local_150.data);
  *(undefined4 *)((long)local_150.data + lVar2) = 1;
  local_198.w = this->num_output;
  local_198.allocator = opt->workspace_allocator;
  local_198.data = (void *)0x0;
  local_198.refcount = (int *)0x0;
  local_198.elemsize = 4;
  local_198.elempack = 1;
  local_198.dims = 2;
  local_198.c = 1;
  sVar8 = (size_t)(local_198.w * _h);
  local_198.h = _h;
  local_198.cstep = sVar8;
  if (local_198.w * _h == 0) {
    iVar6 = -100;
  }
  else {
    sVar1 = sVar8 * 4 + 4;
    if (local_198.allocator == (Allocator *)0x0) {
      local_f0.data = (void *)0x0;
      iVar6 = posix_memalign(&local_f0.data,0x10,sVar1);
      local_198.data = (void *)0x0;
      if (iVar6 == 0) {
        local_198.data = local_f0.data;
      }
    }
    else {
      local_198.data =
           (void *)(**(code **)(*(long *)local_198.allocator + 0x10))(local_198.allocator,sVar1);
    }
    local_198.refcount = (int *)(sVar8 * 4 + (long)local_198.data);
    *(undefined4 *)((long)local_198.data + sVar8 * 4) = 1;
    local_f0.w = (this->weight_xc_data).w;
    local_f0.h = (this->weight_xc_data).h;
    local_f0.data = (this->weight_xc_data).data;
    local_f0.elemsize = (this->weight_xc_data).elemsize;
    local_f0.elempack = (this->weight_xc_data).elempack;
    local_f0.allocator = (this->weight_xc_data).allocator;
    local_f0.refcount = (int *)0x0;
    local_f0.dims = 2;
    local_f0.c = 1;
    local_f0.cstep = (size_t)(local_f0.h * local_f0.w);
    local_70.w = (this->bias_c_data).w;
    local_70.h = (this->bias_c_data).h;
    local_70.data = (this->bias_c_data).data;
    local_70.elemsize = (this->bias_c_data).elemsize;
    local_70.elempack = (this->bias_c_data).elempack;
    local_70.allocator = (this->bias_c_data).allocator;
    local_70.refcount = (int *)0x0;
    local_70.dims = 2;
    local_70.c = 1;
    local_70.cstep = (size_t)(local_70.h * local_70.w);
    local_b0.w = (this->weight_hc_data).w;
    local_b0.h = (this->weight_hc_data).h;
    local_b0.data = (this->weight_hc_data).data;
    local_b0.elemsize = (this->weight_hc_data).elemsize;
    local_b0.elempack = (this->weight_hc_data).elempack;
    local_b0.allocator = (this->weight_hc_data).allocator;
    local_b0.refcount = (int *)0x0;
    local_b0.dims = 2;
    local_b0.c = 1;
    local_b0.cstep = (size_t)(local_b0.h * local_b0.w);
    iVar6 = lstm(bottom_blob,&local_150,0,&local_f0,&local_70,&local_b0,opt);
    if (iVar6 == 0) {
      local_f0.w = (this->weight_xc_data).w;
      local_f0.h = (this->weight_xc_data).h;
      local_f0.elemsize = (this->weight_xc_data).elemsize;
      local_f0.data =
           (void *)((this->weight_xc_data).cstep * local_f0.elemsize +
                   (long)(this->weight_xc_data).data);
      local_f0.elempack = (this->weight_xc_data).elempack;
      local_f0.allocator = (this->weight_xc_data).allocator;
      local_f0.refcount = (int *)0x0;
      local_f0.dims = 2;
      local_f0.c = 1;
      local_f0.cstep = (size_t)(local_f0.h * local_f0.w);
      local_70.w = (this->bias_c_data).w;
      local_70.h = (this->bias_c_data).h;
      local_70.elemsize = (this->bias_c_data).elemsize;
      local_70.data =
           (void *)((this->bias_c_data).cstep * local_70.elemsize + (long)(this->bias_c_data).data);
      local_70.elempack = (this->bias_c_data).elempack;
      local_70.allocator = (this->bias_c_data).allocator;
      local_70.refcount = (int *)0x0;
      local_70.dims = 2;
      local_70.c = 1;
      local_70.cstep = (size_t)(local_70.h * local_70.w);
      local_b0.w = (this->weight_hc_data).w;
      local_b0.elemsize = (this->weight_hc_data).elemsize;
      local_b0.data =
           (void *)((this->weight_hc_data).cstep * local_b0.elemsize +
                   (long)(this->weight_hc_data).data);
      local_b0.h = (this->weight_hc_data).h;
      local_b0.elempack = (this->weight_hc_data).elempack;
      local_b0.allocator = (this->weight_hc_data).allocator;
      local_b0.refcount = (int *)0x0;
      local_b0.dims = 2;
      local_b0.c = 1;
      local_b0.cstep = (size_t)(local_b0.h * local_b0.w);
      iVar7 = lstm(bottom_blob,&local_198,1,&local_f0,&local_70,&local_b0,opt);
      Mat::~Mat(&local_b0);
      Mat::~Mat(&local_70);
      Mat::~Mat(&local_f0);
      iVar5 = local_150.w;
      iVar4 = local_198.w;
      iVar6 = 0;
      if (iVar7 == 0) {
        bVar3 = true;
        if (0 < _h) {
          local_f8 = local_150.data;
          local_100 = local_150.elemsize;
          local_108 = local_198.data;
          local_110 = local_198.elemsize;
          iVar7 = 0;
          iVar9 = 0;
          iVar6 = 0;
          do {
            __src = (void *)(local_110 * (long)iVar7 + (long)local_108);
            __dest = (void *)((long)top_blob->w * (long)iVar6 * top_blob->elemsize +
                             (long)top_blob->data);
            memcpy(__dest,(void *)(local_100 * (long)iVar9 + (long)local_f8),
                   (long)this->num_output << 2);
            memcpy((void *)((long)__dest + (long)this->num_output * 4),__src,
                   (long)this->num_output << 2);
            iVar6 = iVar6 + 1;
            iVar9 = iVar9 + iVar5;
            iVar7 = iVar7 + iVar4;
          } while (_h != iVar6);
          iVar6 = 0;
          bVar3 = true;
        }
      }
      else {
        bVar3 = false;
        iVar6 = iVar7;
      }
      goto LAB_001477cf;
    }
  }
  bVar3 = false;
LAB_001477cf:
  if (local_198.refcount != (int *)0x0) {
    LOCK();
    *local_198.refcount = *local_198.refcount + -1;
    UNLOCK();
    if (*local_198.refcount == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (**(code **)(*(long *)local_198.allocator + 0x18))();
      }
    }
  }
  if (local_150.refcount != (int *)0x0) {
    LOCK();
    *local_150.refcount = *local_150.refcount + -1;
    UNLOCK();
    if (*local_150.refcount == 0) {
      if (local_150.allocator == (Allocator *)0x0) {
        if (local_150.data != (void *)0x0) {
          free(local_150.data);
        }
      }
      else {
        (**(code **)(*(long *)local_150.allocator + 0x18))();
      }
    }
  }
  if (bVar3) {
    return 0;
  }
  return iVar6;
}

Assistant:

int LSTM::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // forward
    if (direction == 0)
    {
        int ret = lstm(bottom_blob, top_blob, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, 1, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), opt);
        if (ret0 != 0)
            return ret0;

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i=0; i<T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}